

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

package * lsvm::object::new_package(symbol *name)

{
  long lVar1;
  long lVar2;
  package *ppVar3;
  symbolmap *psVar4;
  undefined8 *puVar5;
  
  lVar1 = packages;
  if (packages == 0) {
    puVar5 = &packages;
  }
  else {
    do {
      lVar2 = lVar1;
      lVar1 = *(long *)(lVar2 + 0x10);
    } while (lVar1 != 0);
    puVar5 = (undefined8 *)(lVar2 + 0x10);
  }
  ppVar3 = (package *)memory::allocate(0x18);
  ppVar3->name = name;
  psVar4 = symbol::new_symbolmap();
  ppVar3->classes = psVar4;
  *puVar5 = ppVar3;
  return ppVar3;
}

Assistant:

package* new_package(symbol* name){

    package** parent = &packages;
    if(*parent != null){
        do{
            parent = &((*parent)->next);
        }while(*parent != null);
    }

    package* pkg = (package*)lsvm::memory::allocate(sizeof(package));
    pkg->name = name;
    pkg->classes = lsvm::symbol::new_symbolmap();
    *parent = pkg;
    return pkg;    
}